

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

UChar * icu_63::ZoneMeta::getCanonicalCLDRID(TimeZone *tz)

{
  long lVar1;
  _func_int **pp_Var2;
  UErrorCode status;
  UnicodeString tzID;
  UErrorCode local_4c;
  UnicodeString local_48;
  
  lVar1 = __dynamic_cast(tz,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
  if (lVar1 == 0) {
    local_4c = U_ZERO_ERROR;
    local_48.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
    local_48.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::operator=(&local_48,&tz->fID);
    pp_Var2 = (_func_int **)getCanonicalCLDRID(&local_48,&local_4c);
    UnicodeString::~UnicodeString(&local_48);
  }
  else {
    pp_Var2 = tz[2].fID.super_Replaceable.super_UObject._vptr_UObject;
  }
  return (UChar *)pp_Var2;
}

Assistant:

const UChar* U_EXPORT2
ZoneMeta::getCanonicalCLDRID(const TimeZone& tz) {
    if (dynamic_cast<const OlsonTimeZone *>(&tz) != NULL) {
        // short cut for OlsonTimeZone
        const OlsonTimeZone *otz = (const OlsonTimeZone*)&tz;
        return otz->getCanonicalID();
    }
    UErrorCode status = U_ZERO_ERROR;
    UnicodeString tzID;
    return getCanonicalCLDRID(tz.getID(tzID), status);
}